

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

Vector * OrthoRightKer_VQ(Vector *V,QMatrix *Q)

{
  Real *pRVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  Vector *pVVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  V_Lock(V);
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    pVVar8 = V;
    if ((Q->UnitRightKer == False) && (Q->RightKerCmp == (Real *)0x0)) goto LAB_0010da55;
    if (V->Instance == Normal) {
      uVar6 = V->Dim;
      uVar7 = Q->Dim;
      if (uVar6 == uVar7) {
        pRVar1 = V->Cmp;
        if (Q->UnitRightKer == False) {
          if (uVar6 != 0) {
            pRVar2 = Q->RightKerCmp;
            uVar7 = 1;
            dVar9 = 0.0;
            do {
              dVar9 = dVar9 + pRVar1[uVar7] * pRVar2[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar7 <= uVar6);
            if (uVar6 != 0) {
              uVar7 = 1;
              do {
                pRVar1[uVar7] = pRVar2[uVar7] * -dVar9 + pRVar1[uVar7];
                uVar7 = uVar7 + 1;
              } while (uVar7 <= uVar6);
            }
          }
        }
        else if (uVar6 != 0) {
          uVar7 = 1;
          dVar9 = 0.0;
          do {
            dVar9 = dVar9 + pRVar1[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar7 <= uVar6);
          if (uVar6 != 0) {
            auVar10._8_4_ = (int)(uVar6 >> 0x20);
            auVar10._0_8_ = uVar6;
            auVar10._12_4_ = 0x45300000;
            uVar7 = 1;
            do {
              pRVar1[uVar7] =
                   pRVar1[uVar7] -
                   dVar9 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
              uVar7 = uVar7 + 1;
            } while (uVar7 <= uVar6);
          }
        }
        goto LAB_0010da55;
      }
    }
    else {
      pcVar4 = V_GetName(V);
      pcVar5 = Q_GetName(Q);
      LASError(LASLValErr,"OrthoRightKer_VQ",pcVar4,pcVar5,(char *)0x0);
      uVar6 = V->Dim;
      uVar7 = Q->Dim;
    }
    if (uVar6 != uVar7) {
      pcVar4 = V_GetName(V);
      pcVar5 = Q_GetName(Q);
      LASError(LASDimErr,"OrthoRightKer_VQ",pcVar4,pcVar5,(char *)0x0);
      pVVar8 = (Vector *)0x0;
      goto LAB_0010da55;
    }
  }
  pVVar8 = (Vector *)0x0;
LAB_0010da55:
  V_Unlock(V);
  return pVVar8;
}

Assistant:

Vector *OrthoRightKer_VQ(Vector *V, QMatrix *Q)
/* orthogonalize vector V to the "right" null space of matrix Q */
{
    Vector *VRes;

    double Sum, Mean;
    size_t Dim, Ind;
    Real *VCmp, *KerCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->UnitRightKer || Q->RightKerCmp != NULL) {
            if (V->Instance == Normal && V->Dim == Q->Dim) {
                Dim = V->Dim;
                VCmp = V->Cmp;
                KerCmp = Q->RightKerCmp;
            
                if (Q->UnitRightKer) {
                    Sum = 0.0;
                       for_AllCmp 
                        Sum += VCmp[Ind];
                        Mean = Sum / (double)Dim;
                       for_AllCmp 
                        VCmp[Ind] -= Mean;
                } else {
                    Sum = 0.0;
                       for_AllCmp
                        Sum += VCmp[Ind] * KerCmp[Ind];
                       for_AllCmp 
                        VCmp[Ind] -= Sum * KerCmp[Ind];
                    }           
                       
                VRes = V;
            } else {
                if (V->Instance != Normal) 
                    LASError(LASLValErr, "OrthoRightKer_VQ", V_GetName(V), Q_GetName(Q), NULL);
                if (V->Dim != Q->Dim) 
                    LASError(LASDimErr, "OrthoRightKer_VQ", V_GetName(V), Q_GetName(Q), NULL);
                VRes = NULL;
            }
        } else {
            VRes = V;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V);

    return(VRes);
}